

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall embree::SceneGraph::TriangleMeshNode::resetInDegree(TriangleMeshNode *this)

{
  size_t *psVar1;
  
  (this->super_Node).closed = false;
  if ((this->super_Node).indegree == 1) {
    (*(((this->material).ptr)->super_Node).super_RefCount._vptr_RefCount[8])();
  }
  psVar1 = &(this->super_Node).indegree;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void SceneGraph::TriangleMeshNode::resetInDegree()
  {
    closed = false;
    if (indegree == 1)
      material->resetInDegree();
    indegree--;
  }